

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int write_chunk(spng_ctx *ctx,uint8_t *type,void *data,size_t length)

{
  int iVar1;
  uchar *write_ptr;
  uchar *local_20;
  
  iVar1 = 0x50;
  if (((type != (uint8_t *)0x0) && (data != (void *)0x0 || length == 0)) &&
     (iVar1 = write_header(ctx,type,length,&local_20), iVar1 == 0)) {
    if (length != 0) {
      memcpy(local_20,data,length);
    }
    iVar1 = finish_chunk(ctx);
  }
  return iVar1;
}

Assistant:

static int write_chunk(spng_ctx *ctx, const uint8_t type[4], const void *data, size_t length)
{
    if(ctx == NULL || type == NULL) return SPNG_EINTERNAL;
    if(length && data == NULL) return SPNG_EINTERNAL;

    unsigned char *write_ptr;

    int ret = write_header(ctx, type, length, &write_ptr);
    if(ret) return ret;

    if(length) memcpy(write_ptr, data, length);

    return finish_chunk(ctx);
}